

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O1

SUNErrCode
SUNHashMap_New(int64_t capacity,_func_SUNErrCode_SUNHashMapKeyValue_ptr *destroyKeyValue,
              SUNHashMap *map)

{
  long lVar1;
  bool bVar2;
  SUNHashMap __ptr;
  SUNStlVector_SUNHashMapKeyValue pSVar3;
  SUNHashMapKeyValue *ppSVar4;
  SUNErrCode unaff_EBP;
  SUNErrCode SVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar10;
  
  if (capacity < 1) {
    return -0x270d;
  }
  *map = (SUNHashMap)0x0;
  __ptr = (SUNHashMap)malloc(0x10);
  *map = __ptr;
  if ((destroyKeyValue != (_func_SUNErrCode_SUNHashMapKeyValue_ptr *)0x0) &&
     (pSVar3 = (SUNStlVector_SUNHashMapKeyValue)malloc(0x20),
     pSVar3 != (SUNStlVector_SUNHashMapKeyValue)0x0)) {
    ppSVar4 = (SUNHashMapKeyValue *)malloc(capacity * 8);
    pSVar3->values = ppSVar4;
    if (ppSVar4 != (SUNHashMapKeyValue *)0x0) {
      pSVar3->size = 0;
      pSVar3->capacity = capacity;
      pSVar3->destroyValue = destroyKeyValue;
      goto LAB_0010a83b;
    }
  }
  pSVar3 = (SUNStlVector_SUNHashMapKeyValue)0x0;
LAB_0010a83b:
  if (pSVar3 == (SUNStlVector_SUNHashMapKeyValue)0x0) {
    free(__ptr);
    SVar5 = -0x2704;
  }
  else {
    lVar6 = 1;
    if (1 < capacity) {
      lVar6 = capacity;
    }
    bVar2 = true;
    lVar7 = 1;
    do {
      lVar1 = pSVar3->capacity;
      if (pSVar3->size == lVar1) {
        if (lVar1 == 0) {
          lVar8 = 2;
        }
        else {
          lVar10 = in_ST6;
          ceill();
          lVar8 = (long)ROUND(in_ST0);
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = in_ST6;
          in_ST6 = lVar10;
        }
        SVar5 = 0;
        bVar9 = true;
        if (lVar1 < lVar8) {
          ppSVar4 = (SUNHashMapKeyValue *)realloc(pSVar3->values,lVar8 * 8);
          SVar5 = 0;
          if (ppSVar4 == (SUNHashMapKeyValue *)0x0) {
            SVar5 = -0x2704;
            bVar9 = false;
          }
          else {
            pSVar3->values = ppSVar4;
            pSVar3->capacity = lVar8;
            bVar9 = true;
          }
        }
        if (bVar9) goto LAB_0010a902;
      }
      else {
LAB_0010a902:
        lVar1 = pSVar3->size;
        pSVar3->size = lVar1 + 1;
        pSVar3->values[lVar1] = (SUNHashMapKeyValue)0x0;
        SVar5 = 0;
      }
      if (SVar5 != 0) break;
      bVar2 = lVar7 < capacity;
      bVar9 = lVar7 != lVar6;
      lVar7 = lVar7 + 1;
      SVar5 = unaff_EBP;
    } while (bVar9);
    if (!bVar2) {
      (*map)->buckets = pSVar3;
      SVar5 = 0;
    }
  }
  return SVar5;
}

Assistant:

SUNErrCode SUNHashMap_New(int64_t capacity,
                          SUNErrCode (*destroyKeyValue)(SUNHashMapKeyValue* kv_ptr),
                          SUNHashMap* map)
{
  if (capacity <= 0) { return SUN_ERR_ARG_OUTOFRANGE; }

  *map = NULL;
  *map = (SUNHashMap)malloc(sizeof(**map));

  if (!map) { return SUN_ERR_MALLOC_FAIL; }

  SUNStlVector_SUNHashMapKeyValue buckets =
    SUNStlVector_SUNHashMapKeyValue_New(capacity, destroyKeyValue);
  if (!buckets)
  {
    free(*map);
    return SUN_ERR_MALLOC_FAIL;
  }

  /* Initialize all buckets to NULL */
  for (int64_t i = 0; i < capacity; i++)
  {
    SUNErrCode err = SUNStlVector_SUNHashMapKeyValue_PushBack(buckets, NULL);
    if (err) { return err; };
  }

  (*map)->buckets = buckets;

  return SUN_SUCCESS;
}